

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * cmTarget::GetInterfaceFileSetsPropertyName(string *__return_storage_ptr__,string *type)

{
  bool bVar1;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *type_local;
  
  local_18 = type;
  type_local = __return_storage_ptr__;
  bVar1 = std::operator==(type,"HEADERS");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"INTERFACE_HEADER_SETS",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    bVar1 = std::operator==(local_18,"CXX_MODULES");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"INTERFACE_CXX_MODULE_SETS",local_2d);
      std::allocator<char>::~allocator(local_2d);
    }
    else {
      bVar1 = std::operator==(local_18,"CXX_MODULE_HEADER_UNITS");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"INTERFACE_CXX_MODULE_HEADER_UNIT_SETS",
                   &local_2e);
        std::allocator<char>::~allocator(&local_2e);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_2f);
        std::allocator<char>::~allocator(&local_2f);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetInterfaceFileSetsPropertyName(const std::string& type)
{
  if (type == "HEADERS") {
    return "INTERFACE_HEADER_SETS";
  }
  if (type == "CXX_MODULES") {
    return "INTERFACE_CXX_MODULE_SETS";
  }
  if (type == "CXX_MODULE_HEADER_UNITS") {
    return "INTERFACE_CXX_MODULE_HEADER_UNIT_SETS";
  }
  return "";
}